

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int libssh2_session_method_pref(LIBSSH2_SESSION *session,int method_type,char *prefs)

{
  libssh2_endpoint_data *plVar1;
  LIBSSH2_CRYPT_METHOD **ppLVar2;
  int iVar3;
  size_t sVar4;
  LIBSSH2_KEX_METHOD **methodlist;
  LIBSSH2_CRYPT_METHOD **__dest;
  LIBSSH2_COMMON_METHOD *pLVar5;
  size_t sVar6;
  char *pcVar7;
  LIBSSH2_CRYPT_METHOD **__s;
  char **local_38;
  
  sVar4 = strlen(prefs);
  switch(method_type) {
  case 0:
    local_38 = &session->kex_prefs;
    methodlist = libssh2_kex_methods;
    break;
  case 1:
    local_38 = &session->hostkey_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
    break;
  case 2:
    plVar1 = &session->local;
    goto LAB_00108b55;
  case 3:
    plVar1 = &session->remote;
LAB_00108b55:
    local_38 = &plVar1->crypt_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
    break;
  case 4:
    plVar1 = &session->local;
    goto LAB_00108b7f;
  case 5:
    plVar1 = &session->remote;
LAB_00108b7f:
    local_38 = &plVar1->mac_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
    break;
  case 6:
    plVar1 = &session->local;
    goto LAB_00108b91;
  case 7:
    plVar1 = &session->remote;
LAB_00108b91:
    local_38 = &plVar1->comp_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
    break;
  case 8:
    local_38 = &(session->local).lang_prefs;
    goto LAB_00108bb2;
  case 9:
    local_38 = &(session->remote).lang_prefs;
    goto LAB_00108bb2;
  case 10:
    local_38 = &session->sign_algo_prefs;
LAB_00108bb2:
    methodlist = (LIBSSH2_KEX_METHOD **)0x0;
    break;
  default:
    pcVar7 = "Invalid parameter specified for method_type";
    iVar3 = -0x22;
    goto LAB_00108ce4;
  }
  __dest = (LIBSSH2_CRYPT_METHOD **)(*session->alloc)(sVar4 + 1,&session->abstract);
  if (__dest == (LIBSSH2_CRYPT_METHOD **)0x0) {
    pcVar7 = "Error allocated space for method preferences";
    iVar3 = -6;
  }
  else {
    memcpy(__dest,prefs,sVar4 + 1);
    __s = __dest;
    ppLVar2 = (LIBSSH2_CRYPT_METHOD **)methodlist;
    while ((ppLVar2 != (LIBSSH2_CRYPT_METHOD **)0x0 && (*(char *)__s != '\0'))) {
      pcVar7 = strchr((char *)__s,0x2c);
      if (pcVar7 == (char *)0x0) {
        sVar4 = strlen((char *)__s);
      }
      else {
        sVar4 = (long)pcVar7 - (long)__s;
      }
      pLVar5 = kex_get_method_by_name((char *)__s,sVar4,(LIBSSH2_COMMON_METHOD **)methodlist);
      if (pLVar5 == (LIBSSH2_COMMON_METHOD *)0x0) {
        ppLVar2 = __s;
        if (pcVar7 == (char *)0x0) {
          if (__dest < __s) {
            *(char *)((long)__s + -1) = '\0';
            __s = (LIBSSH2_CRYPT_METHOD **)((long)__s + -1);
            ppLVar2 = __s;
          }
          else {
            *(char *)__s = '\0';
          }
        }
        else {
          sVar6 = strlen((char *)__s);
          memmove(__s,pcVar7 + 1,sVar6 - sVar4);
        }
      }
      else {
        __s = (LIBSSH2_CRYPT_METHOD **)(pcVar7 + 1);
        ppLVar2 = __s;
        if (pcVar7 == (char *)0x0) {
          __s = (LIBSSH2_CRYPT_METHOD **)0x0;
          ppLVar2 = __s;
        }
      }
    }
    if (*(char *)__dest != '\0') {
      if (*local_38 != (char *)0x0) {
        (*session->free)(*local_38,&session->abstract);
      }
      *local_38 = (char *)__dest;
      return 0;
    }
    (*session->free)(__dest,&session->abstract);
    pcVar7 = "The requested method(s) are not currently supported";
    iVar3 = -0x21;
  }
LAB_00108ce4:
  iVar3 = _libssh2_error(session,iVar3,pcVar7);
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_session_method_pref(LIBSSH2_SESSION * session, int method_type,
                            const char *prefs)
{
    char **prefvar, *s, *newprefs;
    size_t prefs_len = strlen(prefs);
    const LIBSSH2_COMMON_METHOD **mlist;

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        prefvar = &session->kex_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        prefvar = &session->hostkey_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        prefvar = &session->local.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        prefvar = &session->remote.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
        prefvar = &session->local.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_MAC_SC:
        prefvar = &session->remote.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
        prefvar = &session->local.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_COMP_SC:
        prefvar = &session->remote.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_LANG_CS:
        prefvar = &session->local.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_LANG_SC:
        prefvar = &session->remote.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_SIGN_ALGO:
        prefvar = &session->sign_algo_prefs;
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "Invalid parameter specified for method_type");
    }

    s = newprefs = LIBSSH2_ALLOC(session, prefs_len + 1);
    if(!newprefs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Error allocated space for method preferences");
    }
    memcpy(s, prefs, prefs_len + 1);

    while(s && *s && mlist) {
        char *p = strchr(s, ',');
        size_t method_len = (p ? (size_t)(p - s) : strlen(s));

        if(!kex_get_method_by_name(s, method_len, mlist)) {
            /* Strip out unsupported method */
            if(p) {
                memmove(s, p + 1, strlen(s) - method_len);
            }
            else {
                if(s > newprefs) {
                    *(--s) = '\0';
                }
                else {
                    *s = '\0';
                }
            }
        }
        else {
            s = p ? (p + 1) : NULL;
        }
    }

    if(!*newprefs) {
        LIBSSH2_FREE(session, newprefs);
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "The requested method(s) are not currently "
                              "supported");
    }

    if(*prefvar) {
        LIBSSH2_FREE(session, *prefvar);
    }
    *prefvar = newprefs;

    return 0;
}